

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

void CVmBif::get_str_val_fname(char *buf,size_t buflen,char *str)

{
  size_t sVar1;
  size_t *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t unaff_retaddr;
  size_t copy_len;
  
  vmb_get_len((char *)0x2f4a6d);
  sVar1 = CCharmapToLocal::map_utf8
                    ((CCharmapToLocal *)str,(char *)copy_len,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  in_RDI[sVar1] = '\0';
  return;
}

Assistant:

void CVmBif::get_str_val_fname(VMG_ char *buf, size_t buflen, const char *str)
{
    /* get the length */
    size_t copy_len = vmb_get_len(str);

    /* 
     *   map it into the local filename character set and store the result
     *   in the output buffer - reserve one byte for the null termination
     *   byte 
     */
    copy_len = G_cmap_to_fname->map_utf8(buf, buflen - 1,
                                         str + VMB_LEN, copy_len, 0);

    /* null-terminate the result */
    buf[copy_len] = '\0';
}